

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txout_txoutreference.cpp
# Opt level: O3

void __thiscall
TxOutReference_GetSerializeSize_Test::TestBody(TxOutReference_GetSerializeSize_Test *this)

{
  bool bVar1;
  undefined1 extraout_DL;
  char *message;
  AssertionResult gtest_ar;
  TxOutReference txout_ref;
  TxOut txout;
  Message local_c8;
  AssertHelper local_c0;
  internal local_b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  undefined **local_a8;
  undefined1 local_a0;
  Script local_90;
  code *local_58 [3];
  Script local_40;
  
  local_a8 = (undefined **)cfd::core::Amount::CreateBySatoshiAmount(1000000);
  local_a0 = extraout_DL;
  cfd::core::TxOut::TxOut((TxOut *)local_58,(Amount *)&local_a8,&exp_script);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)&local_a8,(TxOut *)local_58);
  local_c8.ss_.ptr_._0_4_ = cfd::core::AbstractTxOutReference::GetSerializeSize();
  local_c0.data_._0_4_ = 0x22;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_b8,"txout_ref.GetSerializeSize()","34",(uint *)&local_c8,(int *)&local_c0);
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message(&local_c8);
    if (local_b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txout_txoutreference.cpp"
               ,0x42,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if (CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_c8.ss_.ptr_._4_4_,local_c8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8 = &PTR__AbstractTxOutReference_004d2e58;
  cfd::core::Script::~Script(&local_90);
  local_58[0] = cfd::core::TapBranch::GetBaseHash;
  cfd::core::Script::~Script(&local_40);
  return;
}

Assistant:

TEST(TxOutReference, GetSerializeSize) {
  {
    int64_t satoshi = 1000000;
    TxOut txout(Amount::CreateBySatoshiAmount(satoshi), exp_script);
    TxOutReference txout_ref(txout);

    EXPECT_EQ(txout_ref.GetSerializeSize(), 34);
  }
}